

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedEnumFieldGenerator::GenerateSerializationCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *this_00;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n");
  io::Printer::Indent(printer);
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_00);
  if (bVar1) {
    GenerateRepeatedDataSizeCode(this,printer);
    io::Printer::Print(printer,&this->variables_,
                       "output.writeRawVarint32($tag$);\noutput.writeRawVarint32(dataSize);\nfor (int i = 0; i < this.$name$.length; i++) {\n  output.writeRawVarint32(this.$name$[i]);\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "for (int i = 0; i < this.$name$.length; i++) {\n  output.writeInt32($number$, this.$name$[i]);\n}\n"
                      );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n");
  printer->Indent();

  if (descriptor_->options().packed()) {
    GenerateRepeatedDataSizeCode(printer);
    printer->Print(variables_,
      "output.writeRawVarint32($tag$);\n"
      "output.writeRawVarint32(dataSize);\n"
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.writeRawVarint32(this.$name$[i]);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.writeInt32($number$, this.$name$[i]);\n"
      "}\n");
  }

  printer->Outdent();
  printer->Print(variables_,
    "}\n");
}